

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O0

void __thiscall pbrt::SDVertex::oneRing(SDVertex *this,Point3f *p)

{
  SDVertex *pSVar1;
  SDFace *pSVar2;
  undefined8 *in_RSI;
  SDFace *in_RDI;
  SDFace *f2;
  SDFace *face_1;
  SDFace *face;
  SDVertex *in_stack_ffffffffffffffc8;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)((long)in_RDI->f + 9) & 1) == 0) {
    do {
      pSVar1 = SDFace::nextVert(in_RDI,in_stack_ffffffffffffffc8);
      *local_10 = *(undefined8 *)&(pSVar1->p).super_Tuple3<pbrt::Point3,_float>;
      *(float *)(local_10 + 1) = (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.z;
      pSVar2 = SDFace::nextFace(in_RDI,in_stack_ffffffffffffffc8);
      local_10 = (undefined8 *)((long)local_10 + 0xc);
    } while (pSVar2 != (SDFace *)in_RDI->v[2]);
  }
  else {
    do {
      pSVar2 = SDFace::nextFace(in_RDI,in_stack_ffffffffffffffc8);
    } while (pSVar2 != (SDFace *)0x0);
    pSVar1 = SDFace::nextVert(in_RDI,in_stack_ffffffffffffffc8);
    *in_RSI = *(undefined8 *)&(pSVar1->p).super_Tuple3<pbrt::Point3,_float>;
    *(float *)(in_RSI + 1) = (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.z;
    local_10 = (undefined8 *)((long)in_RSI + 0xc);
    do {
      pSVar1 = SDFace::prevVert(in_RDI,in_stack_ffffffffffffffc8);
      *local_10 = *(undefined8 *)&(pSVar1->p).super_Tuple3<pbrt::Point3,_float>;
      *(float *)(local_10 + 1) = (pSVar1->p).super_Tuple3<pbrt::Point3,_float>.z;
      pSVar2 = SDFace::prevFace(in_RDI,in_stack_ffffffffffffffc8);
      local_10 = (undefined8 *)((long)local_10 + 0xc);
    } while (pSVar2 != (SDFace *)0x0);
  }
  return;
}

Assistant:

void SDVertex::oneRing(Point3f *p) {
    if (!boundary) {
        // Get one-ring vertices for interior vertex
        SDFace *face = startFace;
        do {
            *p++ = face->nextVert(this)->p;
            face = face->nextFace(this);
        } while (face != startFace);
    } else {
        // Get one-ring vertices for boundary vertex
        SDFace *face = startFace, *f2;
        while ((f2 = face->nextFace(this)) != nullptr)
            face = f2;
        *p++ = face->nextVert(this)->p;
        do {
            *p++ = face->prevVert(this)->p;
            face = face->prevFace(this);
        } while (face != nullptr);
    }
}